

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O1

Action __thiscall
psy::C::SyntaxDumper::visitExtGNU_AsmStatement(SyntaxDumper *this,ExtGNU_AsmStatementSyntax *node)

{
  SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*> *pSVar1;
  SyntaxNodeSeparatedList<psy::C::ExpressionSyntax_*> *pSVar2;
  SpecifierListSyntax *pSVar3;
  SyntaxToken SStack_58;
  
  SyntaxNode::tokenAtIndex(&SStack_58,(SyntaxNode *)node,node->asmKwTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&SStack_58,node);
  SyntaxToken::~SyntaxToken(&SStack_58);
  for (pSVar3 = node->asmQuals_; pSVar3 != (SpecifierListSyntax *)0x0;
      pSVar3 = (pSVar3->
               super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               ).
               super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               .next) {
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])
              (this,(pSVar3->
                    super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    ).
                    super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    .value);
  }
  SyntaxNode::tokenAtIndex(&SStack_58,(SyntaxNode *)node,node->openParenTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&SStack_58,node);
  SyntaxToken::~SyntaxToken(&SStack_58);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->strLit_);
  SyntaxNode::tokenAtIndex(&SStack_58,(SyntaxNode *)node,node->colon1TkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&SStack_58,node);
  SyntaxToken::~SyntaxToken(&SStack_58);
  for (pSVar1 = node->outOprds_;
      pSVar1 != (SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*> *)0x0;
      pSVar1 = (pSVar1->
               super_CoreSyntaxNodeList<psy::C::ExtGNU_AsmOperandSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*>_>
               ).
               super_List<psy::C::ExtGNU_AsmOperandSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*>_>
               .next) {
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])
              (this,(pSVar1->
                    super_CoreSyntaxNodeList<psy::C::ExtGNU_AsmOperandSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*>_>
                    ).
                    super_List<psy::C::ExtGNU_AsmOperandSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*>_>
                    .value);
    SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*>::delimiterToken(&SStack_58,pSVar1);
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&SStack_58,node);
    SyntaxToken::~SyntaxToken(&SStack_58);
  }
  SyntaxNode::tokenAtIndex(&SStack_58,(SyntaxNode *)node,node->colon2TkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&SStack_58,node);
  SyntaxToken::~SyntaxToken(&SStack_58);
  for (pSVar1 = node->inOprds_;
      pSVar1 != (SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*> *)0x0;
      pSVar1 = (pSVar1->
               super_CoreSyntaxNodeList<psy::C::ExtGNU_AsmOperandSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*>_>
               ).
               super_List<psy::C::ExtGNU_AsmOperandSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*>_>
               .next) {
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])
              (this,(pSVar1->
                    super_CoreSyntaxNodeList<psy::C::ExtGNU_AsmOperandSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*>_>
                    ).
                    super_List<psy::C::ExtGNU_AsmOperandSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*>_>
                    .value);
    SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*>::delimiterToken(&SStack_58,pSVar1);
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&SStack_58,node);
    SyntaxToken::~SyntaxToken(&SStack_58);
  }
  SyntaxNode::tokenAtIndex(&SStack_58,(SyntaxNode *)node,node->colon3TkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&SStack_58,node);
  SyntaxToken::~SyntaxToken(&SStack_58);
  for (pSVar2 = node->clobs_; pSVar2 != (SyntaxNodeSeparatedList<psy::C::ExpressionSyntax_*> *)0x0;
      pSVar2 = (pSVar2->
               super_CoreSyntaxNodeList<psy::C::ExpressionSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExpressionSyntax_*>_>
               ).
               super_List<psy::C::ExpressionSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExpressionSyntax_*>_>
               .next) {
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])
              (this,(pSVar2->
                    super_CoreSyntaxNodeList<psy::C::ExpressionSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExpressionSyntax_*>_>
                    ).
                    super_List<psy::C::ExpressionSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExpressionSyntax_*>_>
                    .value);
    SyntaxNodeSeparatedList<psy::C::ExpressionSyntax_*>::delimiterToken(&SStack_58,pSVar2);
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&SStack_58,node);
    SyntaxToken::~SyntaxToken(&SStack_58);
  }
  SyntaxNode::tokenAtIndex(&SStack_58,(SyntaxNode *)node,node->colon4TkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&SStack_58,node);
  SyntaxToken::~SyntaxToken(&SStack_58);
  for (pSVar2 = node->labels_; pSVar2 != (SyntaxNodeSeparatedList<psy::C::ExpressionSyntax_*> *)0x0;
      pSVar2 = (pSVar2->
               super_CoreSyntaxNodeList<psy::C::ExpressionSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExpressionSyntax_*>_>
               ).
               super_List<psy::C::ExpressionSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExpressionSyntax_*>_>
               .next) {
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])
              (this,(pSVar2->
                    super_CoreSyntaxNodeList<psy::C::ExpressionSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExpressionSyntax_*>_>
                    ).
                    super_List<psy::C::ExpressionSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExpressionSyntax_*>_>
                    .value);
    SyntaxNodeSeparatedList<psy::C::ExpressionSyntax_*>::delimiterToken(&SStack_58,pSVar2);
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&SStack_58,node);
    SyntaxToken::~SyntaxToken(&SStack_58);
  }
  SyntaxNode::tokenAtIndex(&SStack_58,(SyntaxNode *)node,node->closeParenTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&SStack_58,node);
  SyntaxToken::~SyntaxToken(&SStack_58);
  SyntaxNode::tokenAtIndex(&SStack_58,(SyntaxNode *)node,node->semicolonTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&SStack_58,node);
  SyntaxToken::~SyntaxToken(&SStack_58);
  return Skip;
}

Assistant:

virtual Action visitExtGNU_AsmStatement(const ExtGNU_AsmStatementSyntax* node) override
    {
        terminal(node->asmKeyword(), node);
        for (auto it = node->asmQualifiers(); it; it = it->next)
            nonterminal(it->value);
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->stringLiteral());
        terminal(node->colon1Token(), node);
        for (auto it = node->outputOperands(); it; it = it->next) {
            nonterminal(it->value);
            terminal(it->delimiterToken(), node);
        }
        terminal(node->colon2Token(), node);
        for (auto it = node->inputOperands(); it; it = it->next) {
            nonterminal(it->value);
            terminal(it->delimiterToken(), node);
        }
        terminal(node->colon3Token(), node);
        for (auto it = node->clobbers(); it; it = it->next) {
            nonterminal(it->value);
            terminal(it->delimiterToken(), node);
        }
        terminal(node->colon4Token(), node);
        for (auto it = node->gotoLabels(); it; it = it->next) {
            nonterminal(it->value);
            terminal(it->delimiterToken(), node);
        }
        terminal(node->closeParenthesisToken(), node);
        terminal(node->semicolonToken(), node);
        return Action::Skip;
    }